

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

void affect_modify_room(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *paf,bool fAdd)

{
  short sVar1;
  undefined7 in_register_00000011;
  short sVar2;
  long lVar3;
  long *bit1;
  string_view fmt;
  
  sVar2 = paf->modifier;
  sVar1 = paf->where;
  if ((int)CONCAT71(in_register_00000011,fAdd) != 0) {
    if (sVar1 == 2) {
      bit1 = room->room_flags;
    }
    else {
      if (sVar1 != 0) goto LAB_002a8c25;
      bit1 = room->affected_by;
    }
    BITWISE_OR(bit1,paf->bitvector);
    goto LAB_002a8c25;
  }
  if (sVar1 == 0) {
    lVar3 = 0x168;
LAB_002a8c17:
    BITWISE_XAND((long *)((long)room->exit + lVar3 + -0x38),paf->bitvector);
  }
  else if (sVar1 == 2) {
    lVar3 = 0x140;
    goto LAB_002a8c17;
  }
  sVar2 = -sVar2;
LAB_002a8c25:
  switch(paf->location) {
  case 0:
  case 4:
    break;
  case 1:
    room->heal_rate = room->heal_rate + sVar2;
    break;
  case 2:
    room->mana_rate = room->mana_rate + sVar2;
    break;
  case 3:
    room->sector_type = room->sector_type + sVar2;
    break;
  default:
    fmt._M_str = "Affect_modify_room: unknown location {}.";
    fmt._M_len = 0x28;
    CLogger::Warn<short&>((CLogger *)&RS.field_0x140,fmt,&paf->location);
    return;
  }
  return;
}

Assistant:

void affect_modify_room(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *paf, bool fAdd)
{
	int mod = paf->modifier;

	if (fAdd)
	{
		switch (paf->where)
		{
			case TO_ROOM_AFFECTS:
				BITWISE_OR(room->affected_by, paf->bitvector);
				break;
			case TO_ROOM_FLAGS:
				BITWISE_OR(room->room_flags, paf->bitvector);
				break;
			case TO_ROOM_CONST:
				break;
		}
	}
	else
	{
		switch (paf->where)
		{
			case TO_ROOM_AFFECTS:
				BITWISE_XAND(room->affected_by, paf->bitvector);
				break;
			case TO_ROOM_FLAGS:
				BITWISE_XAND(room->room_flags, paf->bitvector);
				break;
			case TO_ROOM_CONST:
				break;
		}

		mod = 0 - mod;
	}

	switch (paf->location)
	{
		case APPLY_ROOM_NONE:
			break;
		case APPLY_ROOM_NOPE:
			break;
		case APPLY_ROOM_HEAL:
			room->heal_rate += mod;
			break;
		case APPLY_ROOM_MANA:
			room->mana_rate += mod;
			break;
		case APPLY_ROOM_SECT:
			room->sector_type += mod;
			break;
		default:
			RS.Logger.Warn("Affect_modify_room: unknown location {}.", paf->location);
			break;
	}
}